

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O0

void __thiscall HEkkDual::chooseColumnSlice(HEkkDual *this,HVector *row_ep)

{
  long lVar1;
  HighsInt HVar2;
  uint uVar3;
  reference pvVar4;
  double *pdVar5;
  long in_RSI;
  HEkkDualRow *in_RDI;
  HighsInt i_3;
  HighsInt i_2;
  HighsInt num_infeasibility;
  HighsInt return_code;
  HighsInt i_1;
  HighsInt i;
  HighsInt row_ap_count;
  HighsInt row_ep_count;
  HighsSimplexInfo *info;
  bool use_row_price_w_switch;
  bool use_col_price;
  double local_density;
  HEkkDualRow *in_stack_000000c8;
  double in_stack_ffffffffffffff78;
  double dVar6;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  int iVar7;
  HighsInt in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  int iVar8;
  int local_68;
  HVector *in_stack_ffffffffffffffb8;
  HEkkDualRow *in_stack_ffffffffffffffc0;
  bool local_1a;
  bool local_19;
  double local_18;
  long local_10;
  HEkkDualRow *this_00;
  
  if (*(int *)&(in_RDI->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish == 0) {
    local_10 = in_RSI;
    this_00 = in_RDI;
    HighsSimplexAnalysis::simplexTimerStart
              ((HighsSimplexAnalysis *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
               ,(HighsInt)((ulong)in_stack_ffffffffffffff78 >> 0x20),
               SUB84(in_stack_ffffffffffffff78,0));
    HEkkDualRow::clear((HEkkDualRow *)
                       &in_RDI[4].packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    in_RDI[4].sorted_workData.
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)in_RDI[5].alt_workGroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
    HEkkDualRow::createFreemove(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    HighsSimplexAnalysis::simplexTimerStop
              ((HighsSimplexAnalysis *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
               ,(HighsInt)((ulong)in_stack_ffffffffffffff78 >> 0x20),
               SUB84(in_stack_ffffffffffffff78,0));
    local_18 = (double)*(int *)(local_10 + 4) * 1.0 * (double)in_RDI->workRange;
    HEkk::choosePriceTechnique
              ((HEkk *)in_RDI->workNumTotPermutation,in_RDI->workNumTotPermutation[0xa05],local_18,
               &stack0xffffffffffffffe7,&local_1a);
    if ((*(byte *)(*(long *)&(in_RDI->freeList)._M_t._M_impl.super__Rb_tree_header._M_header + 0xf1)
        & 1) != 0) {
      HVar2 = *(HighsInt *)(local_10 + 4);
      if ((local_19 & 1U) == 0) {
        if ((local_1a & 1U) == 0) {
          HighsSimplexAnalysis::operationRecordBefore
                    (*(HighsSimplexAnalysis **)
                      &(in_RDI->freeList)._M_t._M_impl.super__Rb_tree_header._M_header,5,HVar2,
                     *(double *)(in_RDI->workNumTotPermutation + 0xa12));
          lVar1 = *(long *)&(in_RDI->freeList)._M_t._M_impl.super__Rb_tree_header._M_header;
          *(int *)(lVar1 + 0x254) = *(int *)(lVar1 + 0x254) + 1;
        }
        else {
          HighsSimplexAnalysis::operationRecordBefore
                    (*(HighsSimplexAnalysis **)
                      &(in_RDI->freeList)._M_t._M_impl.super__Rb_tree_header._M_header,5,HVar2,
                     *(double *)(in_RDI->workNumTotPermutation + 0xa12));
          lVar1 = *(long *)&(in_RDI->freeList)._M_t._M_impl.super__Rb_tree_header._M_header;
          *(int *)(lVar1 + 600) = *(int *)(lVar1 + 600) + 1;
        }
      }
      else {
        HighsSimplexAnalysis::operationRecordBefore
                  (*(HighsSimplexAnalysis **)
                    &(in_RDI->freeList)._M_t._M_impl.super__Rb_tree_header._M_header,5,HVar2,0.0);
        lVar1 = *(long *)&(in_RDI->freeList)._M_t._M_impl.super__Rb_tree_header._M_header;
        *(int *)(lVar1 + 0x250) = *(int *)(lVar1 + 0x250) + 1;
      }
    }
    HighsSimplexAnalysis::simplexTimerStart
              ((HighsSimplexAnalysis *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
               ,(HighsInt)((ulong)in_stack_ffffffffffffff78 >> 0x20),
               SUB84(in_stack_ffffffffffffff78,0));
    ::highs::parallel::spawn<HEkkDual::chooseColumnSlice(HVectorBase<double>*)::__0>
              ((anon_class_16_2_51b7012b_for_functor *)0x78ab25);
    ::highs::parallel::for_each<HEkkDual::chooseColumnSlice(HVectorBase<double>*)::__1>
              ((HighsInt)((ulong)&stack0xfffffffffffffff0 >> 0x20),
               (HighsInt)&stack0xfffffffffffffff0,
               (anon_class_32_4_b1b9b1f6 *)&stack0xffffffffffffffe7,
               (HighsInt)((ulong)in_RDI >> 0x20));
    ::highs::parallel::sync();
    if ((*(byte *)(*(long *)&(in_RDI->freeList)._M_t._M_impl.super__Rb_tree_header._M_header + 0xf1)
        & 1) != 0) {
      for (local_68 = 0; local_68 < *(int *)((long)&in_RDI[6].workMove + 4); local_68 = local_68 + 1
          ) {
      }
      HighsSimplexAnalysis::operationRecordAfter
                ((HighsSimplexAnalysis *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (HighsInt)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                 SUB84(in_stack_ffffffffffffff78,0));
    }
    for (iVar8 = 0; iVar8 < *(int *)((long)&in_RDI[6].workMove + 4); iVar8 = iVar8 + 1) {
      std::vector<HEkkDualRow,_std::allocator<HEkkDualRow>_>::operator[]
                ((vector<HEkkDualRow,_std::allocator<HEkkDualRow>_> *)&in_RDI[0xf].alt_workCount,
                 (long)iVar8);
      HEkkDualRow::chooseJoinpack
                ((HEkkDualRow *)CONCAT44(iVar8,in_stack_ffffffffffffff90),
                 (HEkkDualRow *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    }
    HighsSimplexAnalysis::simplexTimerStop
              ((HighsSimplexAnalysis *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
               ,(HighsInt)((ulong)in_stack_ffffffffffffff78 >> 0x20),
               SUB84(in_stack_ffffffffffffff78,0));
    *(undefined4 *)
     ((long)&in_RDI[5].sorted_workData.
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0xffffffff;
    if (((double)in_RDI[4].alt_workGroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish <= 0.0) ||
       (*(int *)((long)&in_RDI[4].alt_workGroup.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage + 4) == 0)) {
      *(undefined4 *)
       &(in_RDI->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = 6;
    }
    else {
      HVar2 = HEkkDualRow::chooseFinal(in_stack_000000c8);
      if (HVar2 == 0) {
        if (*(int *)((long)&in_RDI[6].workMove + 4) == 0) {
          uVar3 = HEkkDualRow::debugChooseColumnInfeasibilities(this_00);
          if (uVar3 != 0) {
            highsLogDev((HighsLogOptions *)(*(long *)(in_RDI->workNumTotPermutation + 2) + 0x380),
                        kError,"chooseFinal would create %d dual infeasibilities\n",(ulong)uVar3);
            HighsSimplexAnalysis::simplexTimerStop
                      ((HighsSimplexAnalysis *)
                       CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       (HighsInt)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                       SUB84(in_stack_ffffffffffffff78,0));
            *(undefined4 *)
             &(in_RDI->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = 9;
            return;
          }
          in_stack_ffffffffffffff8c = 0;
        }
        HighsSimplexAnalysis::simplexTimerStart
                  ((HighsSimplexAnalysis *)
                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (HighsInt)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                   SUB84(in_stack_ffffffffffffff78,0));
        HEkkDualRow::deleteFreemove((HEkkDualRow *)CONCAT44(iVar8,HVar2));
        HighsSimplexAnalysis::simplexTimerStop
                  ((HighsSimplexAnalysis *)
                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (HighsInt)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                   SUB84(in_stack_ffffffffffffff78,0));
        *(undefined4 *)
         ((long)&in_RDI[5].sorted_workData.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) =
             *(undefined4 *)
              &in_RDI[4].alt_workGroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
        in_RDI[6].ekk_instance_ =
             (HEkk *)in_RDI[4].alt_workGroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
        in_RDI[5].alt_workGroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             in_RDI[4].alt_workGroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if ((*(int *)((long)&in_RDI->workDelta + 4) == 1) && ((in_RDI->workSize & 1) == 0)) {
          HighsSimplexAnalysis::simplexTimerStart
                    ((HighsSimplexAnalysis *)
                     CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (HighsInt)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                     SUB84(in_stack_ffffffffffffff78,0));
          HEkkDualRow::computeDevexWeight
                    ((HEkkDualRow *)CONCAT44(iVar8,HVar2),in_stack_ffffffffffffff8c);
          for (iVar7 = 0; iVar7 < *(int *)((long)&in_RDI[6].workMove + 4); iVar7 = iVar7 + 1) {
            std::vector<HEkkDualRow,_std::allocator<HEkkDualRow>_>::operator[]
                      ((vector<HEkkDualRow,_std::allocator<HEkkDualRow>_> *)
                       &in_RDI[0xf].alt_workCount,(long)iVar7);
            HEkkDualRow::computeDevexWeight
                      ((HEkkDualRow *)CONCAT44(iVar8,HVar2),in_stack_ffffffffffffff8c);
          }
          in_RDI[6].workNumTotPermutation =
               &(in_RDI[4].sorted_workData.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->first;
          for (iVar8 = 0; iVar8 < *(int *)((long)&in_RDI[6].workMove + 4); iVar8 = iVar8 + 1) {
            pvVar4 = std::vector<HEkkDualRow,_std::allocator<HEkkDualRow>_>::operator[]
                               ((vector<HEkkDualRow,_std::allocator<HEkkDualRow>_> *)
                                &in_RDI[0xf].alt_workCount,(long)iVar8);
            in_RDI[6].workNumTotPermutation =
                 (HighsInt *)
                 (pvVar4->computed_edge_weight + (double)in_RDI[6].workNumTotPermutation);
          }
          dVar6 = 1.0;
          pdVar5 = std::max<double>((double *)&stack0xffffffffffffff78,
                                    (double *)&in_RDI[6].workNumTotPermutation);
          in_RDI[6].workNumTotPermutation = (HighsInt *)*pdVar5;
          HighsSimplexAnalysis::simplexTimerStop
                    ((HighsSimplexAnalysis *)CONCAT44(iVar8,in_stack_ffffffffffffff80),
                     (HighsInt)((ulong)dVar6 >> 0x20),SUB84(dVar6,0));
        }
      }
      else if (HVar2 < 0) {
        *(undefined4 *)
         &(in_RDI->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = 9;
      }
      else {
        *(undefined4 *)
         &(in_RDI->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = 6;
      }
    }
  }
  return;
}

Assistant:

void HEkkDual::chooseColumnSlice(HVector* row_ep) {
  // Choose the index of a column to enter the basis (CHUZC) by
  // exploiting slices of the pivotal row - for SIP and PAMI
  //
  // If reinversion is needed then skip this method
  if (rebuild_reason) return;

  analysis->simplexTimerStart(Chuzc0Clock);
  dualRow.clear();
  dualRow.workDelta = delta_primal;
  dualRow.createFreemove(row_ep);
  analysis->simplexTimerStop(Chuzc0Clock);

  //  const HighsInt solver_num_row = ekk_instance_.lp_.num_row_;
  const double local_density = 1.0 * row_ep->count * inv_solver_num_row;
  bool use_col_price;
  bool use_row_price_w_switch;
  HighsSimplexInfo& info = ekk_instance_.info_;
  ekk_instance_.choosePriceTechnique(info.price_strategy, local_density,
                                     use_col_price, use_row_price_w_switch);

  if (analysis->analyse_simplex_summary_data) {
    const HighsInt row_ep_count = row_ep->count;
    if (use_col_price) {
      analysis->operationRecordBefore(kSimplexNlaPriceAp, row_ep_count, 0.0);
      analysis->num_col_price++;
    } else if (use_row_price_w_switch) {
      analysis->operationRecordBefore(kSimplexNlaPriceAp, row_ep_count,
                                      ekk_instance_.info_.row_ep_density);
      analysis->num_row_price_with_switch++;
    } else {
      analysis->operationRecordBefore(kSimplexNlaPriceAp, row_ep_count,
                                      ekk_instance_.info_.row_ep_density);
      analysis->num_row_price++;
    }
  }
  analysis->simplexTimerStart(PriceChuzc1Clock);
  // Row_ep:         PACK + CC1

  highs::parallel::spawn([&]() {
    dualRow.chooseMakepack(row_ep, solver_num_col);
    dualRow.choosePossible();
  });

  // Row_ap: PRICE + PACK + CC1
  highs::parallel::for_each(0, slice_num, [&](HighsInt start, HighsInt end) {
    const bool quad_precision = false;
    for (HighsInt i = start; i < end; i++) {
      slice_row_ap[i].clear();

      if (use_col_price) {
        // Perform column-wise PRICE
        slice_a_matrix[i].priceByColumn(quad_precision, slice_row_ap[i],
                                        *row_ep);
      } else if (use_row_price_w_switch) {
        // Perform hyper-sparse row-wise PRICE, but switch if the density of
        // row_ap becomes extreme
        slice_ar_matrix[i].priceByRowWithSwitch(
            quad_precision, slice_row_ap[i], *row_ep,
            ekk_instance_.info_.row_ap_density, 0, kHyperPriceDensity);
      } else {
        // Perform hyper-sparse row-wise PRICE
        slice_ar_matrix[i].priceByRow(quad_precision, slice_row_ap[i], *row_ep);
      }

      slice_dualRow[i].clear();
      slice_dualRow[i].workDelta = delta_primal;
      slice_dualRow[i].chooseMakepack(&slice_row_ap[i], slice_start[i]);
      slice_dualRow[i].choosePossible();
    }
  });

  highs::parallel::sync();

  if (analysis->analyse_simplex_summary_data) {
    // Determine the nonzero count of the whole row
    HighsInt row_ap_count = 0;
    for (HighsInt i = 0; i < slice_num; i++)
      row_ap_count += slice_row_ap[i].count;
    analysis->operationRecordAfter(kSimplexNlaPriceAp, row_ap_count);
  }

  // Join CC1 results here
  for (HighsInt i = 0; i < slice_num; i++) {
    dualRow.chooseJoinpack(&slice_dualRow[i]);
  }

  analysis->simplexTimerStop(PriceChuzc1Clock);

  // Infeasible we created before
  variable_in = -1;
  if (dualRow.workTheta <= 0 || dualRow.workCount == 0) {
    rebuild_reason = kRebuildReasonPossiblyDualUnbounded;
    return;
  }

  // Choose column 2, This only happens if didn't go out
  HighsInt return_code = dualRow.chooseFinal();
  if (return_code) {
    // Only returns -1, if not zero
    assert(return_code == -1);
    if (return_code < 0) {
      rebuild_reason = kRebuildReasonChooseColumnFail;
    } else {
      rebuild_reason = kRebuildReasonPossiblyDualUnbounded;
    }
    return;
  }

  if (slice_num == 0) {
    // This check is only done for serial code - since packIndex/Value
    // is distributed
    HighsInt num_infeasibility = dualRow.debugChooseColumnInfeasibilities();
    if (num_infeasibility) {
      highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kError,
                  "chooseFinal would create %d dual infeasibilities\n",
                  (int)num_infeasibility);
      analysis->simplexTimerStop(Chuzc4dClock);
      rebuild_reason = kRebuildReasonChooseColumnFail;
      return;
    }
  }

  analysis->simplexTimerStart(Chuzc5Clock);
  dualRow.deleteFreemove();
  analysis->simplexTimerStop(Chuzc5Clock);

  variable_in = dualRow.workPivot;
  alpha_row = dualRow.workAlpha;
  theta_dual = dualRow.workTheta;

  if (edge_weight_mode == EdgeWeightMode::kDevex && !new_devex_framework) {
    // When using Devex, unless a new framework is to be used, get the
    // exact weight for the pivotal row and, based on its accuracy,
    // determine that a new framework is to be used. In serial
    // new_devex_framework should only ever be false at this point in
    // this method, but in PAMI, this method may be called multiple
    // times in minor iterations and the new framework is set up in
    // majorUpdate.
    analysis->simplexTimerStart(DevexWtClock);
    // Determine the partial sums of the exact Devex weight
    // First the partial sum for row_ep
    dualRow.computeDevexWeight();
    // Second the partial sums for the slices of row_ap
    for (HighsInt i = 0; i < slice_num; i++)
      slice_dualRow[i].computeDevexWeight(i);
    // Accumulate the partial sums
    // Initialise with the partial sum for row_ep
    computed_edge_weight = dualRow.computed_edge_weight;
    // Update with the partial sum for row_ep
    for (HighsInt i = 0; i < slice_num; i++)
      computed_edge_weight += slice_dualRow[i].computed_edge_weight;
    computed_edge_weight = max(1.0, computed_edge_weight);
    analysis->simplexTimerStop(DevexWtClock);
  }
}